

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

AnonymousProgramSyntax * __thiscall
slang::parsing::Parser::parseAnonymousProgram(Parser *this,AttrList attributes)

{
  SyntaxNode *pSVar1;
  bool bVar2;
  int iVar3;
  Diagnostic *this_00;
  SourceLocation SVar4;
  undefined4 extraout_var;
  AnonymousProgramSyntax *pAVar5;
  BumpAllocator *dst;
  bool bVar6;
  byte bVar7;
  bool bVar8;
  Token TVar9;
  SourceRange range;
  string_view arg;
  Token semi;
  Token keyword;
  bool anyLocalModules;
  MemberSyntax *member;
  Preprocessor *local_118;
  pointer local_110;
  size_t local_108;
  Info *local_100;
  undefined8 local_f8;
  Info *local_f0;
  undefined8 local_e8;
  Token *local_e0;
  Token *local_d8;
  Token endkeyword;
  SyntaxList<slang::syntax::MemberSyntax> local_c0;
  SmallVector<slang::syntax::MemberSyntax_*,_8UL> members;
  
  local_108 = (size_t)attributes._M_extent._M_extent_value;
  local_110 = attributes._M_ptr;
  local_118 = (this->super_ParserBase).window.tokenSource;
  local_118->designElementDepth = local_118->designElementDepth + 1;
  TVar9 = ParserBase::consume(&this->super_ParserBase);
  local_f0 = TVar9.info;
  local_e8 = TVar9._0_8_;
  TVar9 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  local_100 = TVar9.info;
  local_f8 = TVar9._0_8_;
  Token::Token(&endkeyword);
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.data_ =
       (pointer)members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement;
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len = 0;
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap = 8;
  anyLocalModules = false;
  local_d8 = &(this->super_ParserBase).lastPoppedDelims.first;
  local_e0 = &(this->super_ParserBase).lastPoppedDelims.second;
  bVar6 = false;
  while( true ) {
    TVar9 = ParserBase::peek(&this->super_ParserBase);
    if ((TVar9.kind == EndOfFile) || ((TVar9._0_4_ & 0xffff) == 0x9b)) break;
    member = parseMember(this,AnonymousProgram,&anyLocalModules);
    bVar8 = member == (MemberSyntax *)0x0;
    if (bVar8) {
      bVar2 = slang::syntax::SyntaxFacts::isCloseDelimOrKeyword(TVar9.kind);
      if (bVar2) {
        local_c0.super_SyntaxListBase._0_16_ = ParserBase::peek(&this->super_ParserBase);
        range = Token::range((Token *)&local_c0);
        this_00 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xb80005,range);
        local_c0.super_SyntaxListBase._0_16_ = ParserBase::peek(&this->super_ParserBase);
        arg = Token::valueText((Token *)&local_c0);
        Diagnostic::operator<<(this_00,arg);
        bVar7 = 0;
        if (((this->super_ParserBase).lastPoppedDelims.first.info != (Info *)0x0) &&
           (bVar7 = 0, (this->super_ParserBase).lastPoppedDelims.second.info != (Info *)0x0)) {
          SVar4 = Token::location(local_d8);
          Diagnostic::addNote(this_00,(DiagCode)0xc10005,SVar4);
          SVar4 = Token::location(local_e0);
          Diagnostic::addNote(this_00,(DiagCode)0xc00005,SVar4);
          bVar7 = 0;
        }
      }
      else {
        bVar7 = ~bVar6 & 1;
      }
      ParserBase::skipToken
                (&this->super_ParserBase,
                 (optional<slang::DiagCode>)((uint6)bVar7 << 0x20 | 0x450005));
      bVar6 = bVar8;
    }
    else {
      checkMemberAllowed(this,&member->super_SyntaxNode,AnonymousProgram);
      SmallVectorBase<slang::syntax::MemberSyntax*>::
      emplace_back<slang::syntax::MemberSyntax*const&>
                ((SmallVectorBase<slang::syntax::MemberSyntax*> *)&members,&member);
      pSVar1 = this->previewNode;
      this->previewNode = (SyntaxNode *)0x0;
      (member->super_SyntaxNode).previewNode = pSVar1;
      bVar6 = bVar8;
    }
  }
  if (anyLocalModules == true) {
    SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    ::pop_back(&(this->moduleDeclStack).
                super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
              );
  }
  endkeyword = ParserBase::expect(&this->super_ParserBase,EndProgramKeyword);
  dst = (this->super_ParserBase).alloc;
  iVar3 = SmallVectorBase<slang::syntax::MemberSyntax_*>::copy
                    (&members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>,
                     (EVP_PKEY_CTX *)dst,(EVP_PKEY_CTX *)endkeyword.info);
  SmallVectorBase<slang::syntax::MemberSyntax_*>::cleanup
            (&members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>,(EVP_PKEY_CTX *)dst);
  local_118->designElementDepth = local_118->designElementDepth + -1;
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len =
       CONCAT44(members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len._4_4_,1);
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap = 0;
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[0] = '\0';
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[1] = '\0';
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[2] = '\0';
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[3] = '\0';
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[4] = '\0';
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[5] = '\0';
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[6] = '\0';
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[7] = '\0';
  members.stackBase[0] = (undefined1)local_108;
  members.stackBase[1] = local_108._1_1_;
  members.stackBase[2] = local_108._2_1_;
  members.stackBase[3] = local_108._3_1_;
  members.stackBase[4] = local_108._4_1_;
  members.stackBase[5] = local_108._5_1_;
  members.stackBase[6] = local_108._6_1_;
  members.stackBase[7] = local_108._7_1_;
  members.stackBase._8_8_ = local_110;
  members.stackBase[0x10] = (undefined1)local_108;
  members.stackBase[0x11] = local_108._1_1_;
  members.stackBase[0x12] = local_108._2_1_;
  members.stackBase[0x13] = local_108._3_1_;
  members.stackBase[0x14] = local_108._4_1_;
  members.stackBase[0x15] = local_108._5_1_;
  members.stackBase[0x16] = local_108._6_1_;
  members.stackBase[0x17] = local_108._7_1_;
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.data_ =
       (pointer)&PTR_getChild_006a3268;
  local_c0.super_SyntaxListBase.super_SyntaxNode.kind = 1;
  local_c0.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_c0.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_c0.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_006a3358;
  semi.info = local_100;
  semi.kind = (undefined2)local_f8;
  semi._2_1_ = local_f8._2_1_;
  semi.numFlags.raw = local_f8._3_1_;
  semi.rawLen = local_f8._4_4_;
  keyword.info = local_f0;
  keyword.kind = (undefined2)local_e8;
  keyword._2_1_ = local_e8._2_1_;
  keyword.numFlags.raw = local_e8._3_1_;
  keyword.rawLen = local_e8._4_4_;
  local_c0.super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_ptr =
       (pointer)CONCAT44(extraout_var,iVar3);
  pAVar5 = slang::syntax::SyntaxFactory::anonymousProgram
                     (&this->factory,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&members,
                      keyword,semi,&local_c0,endkeyword);
  return pAVar5;
}

Assistant:

AnonymousProgramSyntax& Parser::parseAnonymousProgram(AttrList attributes) {
    auto& pp = getPP();
    pp.pushDesignElementStack();

    auto keyword = consume();
    auto semi = expect(TokenKind::Semicolon);

    Token endkeyword;
    auto members = parseMemberList<MemberSyntax>(
        TokenKind::EndProgramKeyword, endkeyword, SyntaxKind::AnonymousProgram,
        [this](SyntaxKind parentKind, bool& anyLocalModules) {
            return parseMember(parentKind, anyLocalModules);
        });

    pp.popDesignElementStack();

    return factory.anonymousProgram(attributes, keyword, semi, members, endkeyword);
}